

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O1

void duckdb::AggregateExecutor::
     UnaryFlatLoop<duckdb::QuantileState<duckdb::timestamp_t,duckdb::QuantileStandardType>,duckdb::timestamp_t,duckdb::MedianAbsoluteDeviationOperation<duckdb::timestamp_t>>
               (timestamp_t *idata,AggregateInputData *aggr_input_data,
               QuantileState<duckdb::timestamp_t,_duckdb::QuantileStandardType> **states,
               ValidityMask *mask,idx_t count)

{
  unsigned_long *puVar1;
  QuantileState<duckdb::timestamp_t,_duckdb::QuantileStandardType> *pQVar2;
  iterator iVar3;
  QuantileState<duckdb::timestamp_t,_duckdb::QuantileStandardType> **ppQVar4;
  timestamp_t *ptVar5;
  ulong uVar6;
  idx_t iVar7;
  ulong uVar8;
  ulong uVar9;
  unsigned_long uVar10;
  timestamp_t local_68;
  QuantileState<duckdb::timestamp_t,_duckdb::QuantileStandardType> **local_60;
  timestamp_t *local_58;
  ulong local_50;
  ValidityMask *local_48;
  idx_t local_40;
  ulong local_38;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      iVar7 = 0;
      do {
        pQVar2 = states[iVar7];
        local_68.value = idata[iVar7].value;
        iVar3._M_current =
             (((_Vector_base<duckdb::timestamp_t,_std::allocator<duckdb::timestamp_t>_> *)&pQVar2->v
              )->_M_impl).super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (((_Vector_base<duckdb::timestamp_t,_std::allocator<duckdb::timestamp_t>_> *)&pQVar2->v)
            ->_M_impl).super__Vector_impl_data._M_end_of_storage) {
          std::vector<duckdb::timestamp_t,_std::allocator<duckdb::timestamp_t>_>::
          _M_realloc_insert<duckdb::timestamp_t>
                    ((vector<duckdb::timestamp_t,_std::allocator<duckdb::timestamp_t>_> *)pQVar2,
                     iVar3,&local_68);
        }
        else {
          (iVar3._M_current)->value = local_68.value;
          (((_Vector_base<duckdb::timestamp_t,_std::allocator<duckdb::timestamp_t>_> *)&pQVar2->v)->
          _M_impl).super__Vector_impl_data._M_finish = iVar3._M_current + 1;
        }
        iVar7 = iVar7 + 1;
      } while (count != iVar7);
    }
  }
  else if (0x3f < count + 0x3f) {
    local_50 = count + 0x3f >> 6;
    local_38 = 0;
    uVar8 = 0;
    local_60 = states;
    local_58 = idata;
    local_48 = mask;
    local_40 = count;
    do {
      ptVar5 = local_58;
      ppQVar4 = local_60;
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar10 = 0xffffffffffffffff;
      }
      else {
        uVar10 = puVar1[local_38];
      }
      uVar6 = uVar8 + 0x40;
      if (count <= uVar8 + 0x40) {
        uVar6 = count;
      }
      uVar9 = uVar6;
      if (uVar10 != 0) {
        uVar9 = uVar8;
        if (uVar10 == 0xffffffffffffffff) {
          if (uVar8 < uVar6) {
            do {
              pQVar2 = states[uVar9];
              local_68.value = ptVar5[uVar9].value;
              iVar3._M_current =
                   (((_Vector_base<duckdb::timestamp_t,_std::allocator<duckdb::timestamp_t>_> *)
                    &pQVar2->v)->_M_impl).super__Vector_impl_data._M_finish;
              if (iVar3._M_current ==
                  (((_Vector_base<duckdb::timestamp_t,_std::allocator<duckdb::timestamp_t>_> *)
                   &pQVar2->v)->_M_impl).super__Vector_impl_data._M_end_of_storage) {
                std::vector<duckdb::timestamp_t,_std::allocator<duckdb::timestamp_t>_>::
                _M_realloc_insert<duckdb::timestamp_t>
                          ((vector<duckdb::timestamp_t,_std::allocator<duckdb::timestamp_t>_> *)
                           pQVar2,iVar3,&local_68);
              }
              else {
                (iVar3._M_current)->value = local_68.value;
                (((_Vector_base<duckdb::timestamp_t,_std::allocator<duckdb::timestamp_t>_> *)
                 &pQVar2->v)->_M_impl).super__Vector_impl_data._M_finish = iVar3._M_current + 1;
              }
              uVar9 = uVar9 + 1;
            } while (uVar6 != uVar9);
          }
        }
        else {
          states = local_60;
          if (uVar8 < uVar6) {
            uVar9 = 0;
            do {
              if ((uVar10 >> (uVar9 & 0x3f) & 1) != 0) {
                pQVar2 = ppQVar4[uVar8 + uVar9];
                local_68.value = ptVar5[uVar8 + uVar9].value;
                iVar3._M_current =
                     (((_Vector_base<duckdb::timestamp_t,_std::allocator<duckdb::timestamp_t>_> *)
                      &pQVar2->v)->_M_impl).super__Vector_impl_data._M_finish;
                if (iVar3._M_current ==
                    (((_Vector_base<duckdb::timestamp_t,_std::allocator<duckdb::timestamp_t>_> *)
                     &pQVar2->v)->_M_impl).super__Vector_impl_data._M_end_of_storage) {
                  std::vector<duckdb::timestamp_t,_std::allocator<duckdb::timestamp_t>_>::
                  _M_realloc_insert<duckdb::timestamp_t>
                            ((vector<duckdb::timestamp_t,_std::allocator<duckdb::timestamp_t>_> *)
                             pQVar2,iVar3,&local_68);
                }
                else {
                  (iVar3._M_current)->value = local_68.value;
                  (((_Vector_base<duckdb::timestamp_t,_std::allocator<duckdb::timestamp_t>_> *)
                   &pQVar2->v)->_M_impl).super__Vector_impl_data._M_finish = iVar3._M_current + 1;
                }
              }
              uVar9 = uVar9 + 1;
            } while ((uVar8 - uVar6) + uVar9 != 0);
            uVar9 = uVar8 + uVar9;
            mask = local_48;
            states = local_60;
            count = local_40;
          }
        }
      }
      local_38 = local_38 + 1;
      uVar8 = uVar9;
    } while (local_38 != local_50);
  }
  return;
}

Assistant:

static inline void UnaryFlatLoop(const INPUT_TYPE *__restrict idata, AggregateInputData &aggr_input_data,
	                                 STATE_TYPE **__restrict states, ValidityMask &mask, idx_t count) {
		if (OP::IgnoreNull() && !mask.AllValid()) {
			AggregateUnaryInput input(aggr_input_data, mask);
			auto &base_idx = input.input_idx;
			base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[base_idx], idata[base_idx], input);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[base_idx], idata[base_idx],
							                                                   input);
						}
					}
				}
			}
		} else {
			AggregateUnaryInput input(aggr_input_data, mask);
			auto &i = input.input_idx;
			for (i = 0; i < count; i++) {
				OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[i], idata[i], input);
			}
		}
	}